

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::fixXfbOffsets(TParseContext *this,TQualifier *qualifier,TTypeList *typeList)

{
  TIntermediate *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  undefined4 extraout_var;
  bool local_33;
  bool local_32;
  bool local_31;
  int memberSize;
  bool contains16BitType;
  bool contains32BitType;
  bool contains64BitType;
  TQualifier *memberQualifier;
  uint member;
  int nextOffset;
  TTypeList *typeList_local;
  TQualifier *qualifier_local;
  TParseContext *this_local;
  
  _member = &typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
  typeList_local = (TTypeList *)qualifier;
  qualifier_local = (TQualifier *)this;
  bVar1 = TQualifier::hasXfbBuffer(qualifier);
  if ((bVar1) && (bVar1 = TQualifier::hasXfbOffset((TQualifier *)typeList_local), bVar1)) {
    memberQualifier._4_4_ =
         (uint)(*(ulong *)((long)&typeList_local[1].
                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  .
                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ._M_impl.super__Tp_alloc_type.allocator + 4) >> 0x12) & 0x1fff;
    for (memberQualifier._0_4_ = 0; uVar4 = (ulong)(uint)memberQualifier,
        sVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          (_member), uVar4 < sVar5;
        memberQualifier._0_4_ = (uint)memberQualifier + 1) {
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](_member,(ulong)(uint)memberQualifier);
      iVar2 = (*pvVar6->type->_vptr_TType[10])();
      _memberSize = (TQualifier *)CONCAT44(extraout_var,iVar2);
      local_31 = false;
      local_32 = false;
      local_33 = false;
      this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](_member,(ulong)(uint)memberQualifier);
      uVar3 = TIntermediate::computeTypeXfbSize(this_00,pvVar6->type,&local_31,&local_32,&local_33);
      bVar1 = TQualifier::hasXfbOffset(_memberSize);
      if (bVar1) {
        memberQualifier._4_4_ = (uint)(*(ulong *)&_memberSize->field_0x24 >> 0x12) & 0x1fff;
      }
      else {
        if ((local_31 & 1U) == 0) {
          if ((local_32 & 1U) == 0) {
            if ((local_33 & 1U) != 0) {
              RoundToPow2<int>((int *)((long)&memberQualifier + 4),2);
            }
          }
          else {
            RoundToPow2<int>((int *)((long)&memberQualifier + 4),4);
          }
        }
        else {
          RoundToPow2<int>((int *)((long)&memberQualifier + 4),8);
        }
        *(ulong *)&_memberSize->field_0x24 =
             *(ulong *)&_memberSize->field_0x24 & 0xffffffff8003ffff |
             ((ulong)memberQualifier._4_4_ & 0x1fff) << 0x12;
      }
      memberQualifier._4_4_ = uVar3 + memberQualifier._4_4_;
    }
    *(ulong *)((long)&typeList_local[1].
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      ._M_impl.super__Tp_alloc_type.allocator + 4) =
         *(ulong *)((long)&typeList_local[1].
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           .
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Tp_alloc_type.allocator + 4) & 0xffffffff8003ffff |
         0x7ffc0000;
  }
  return;
}

Assistant:

void TParseContext::fixXfbOffsets(TQualifier& qualifier, TTypeList& typeList)
{
    // "If a block is qualified with xfb_offset, all its
    // members are assigned transform feedback buffer offsets. If a block is not qualified with xfb_offset, any
    // members of that block not qualified with an xfb_offset will not be assigned transform feedback buffer
    // offsets."

    if (! qualifier.hasXfbBuffer() || ! qualifier.hasXfbOffset())
        return;

    int nextOffset = qualifier.layoutXfbOffset;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        bool contains64BitType = false;
        bool contains32BitType = false;
        bool contains16BitType = false;
        int memberSize = intermediate.computeTypeXfbSize(*typeList[member].type, contains64BitType, contains32BitType, contains16BitType);
        // see if we need to auto-assign an offset to this member
        if (! memberQualifier.hasXfbOffset()) {
            // "if applied to an aggregate containing a double or 64-bit integer, the offset must also be a multiple of 8"
            if (contains64BitType)
                RoundToPow2(nextOffset, 8);
            else if (contains32BitType)
                RoundToPow2(nextOffset, 4);
            else if (contains16BitType)
                RoundToPow2(nextOffset, 2);
            memberQualifier.layoutXfbOffset = nextOffset;
        } else
            nextOffset = memberQualifier.layoutXfbOffset;
        nextOffset += memberSize;
    }

    // The above gave all block members an offset, so we can take it off the block now,
    // which will avoid double counting the offset usage.
    qualifier.layoutXfbOffset = TQualifier::layoutXfbOffsetEnd;
}